

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::detach(Thread *this)

{
  Fault local_20;
  Fault f;
  int pthreadResult;
  Thread *this_local;
  
  f.exception._4_4_ = pthread_detach(this->threadId);
  if (f.exception._4_4_ != 0) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x78,f.exception._4_4_,"pthread_detach","");
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  this->detached = true;
  ThreadState::unref(this->state);
  return;
}

Assistant:

void Thread::detach() {
  int pthreadResult = pthread_detach(*reinterpret_cast<pthread_t*>(&threadId));
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_detach", pthreadResult) { break; }
  }
  detached = true;
  state->unref();
}